

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O2

void __thiscall string_view_rbegin_rend_Test::TestBody(string_view_rbegin_rend_Test *this)

{
  long lVar1;
  char *pcVar2;
  char local_51;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  lVar1 = 5;
  local_51 = '\0';
  do {
    if (lVar1 == -1) {
      local_50.ptr_._0_4_ = 6;
      testing::internal::CmpHelperEQ<int,char>
                ((internal *)&gtest_ar,"6","count",(int *)&local_50,&local_51);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_50);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                   ,0x6c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
LAB_00206e37:
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_50);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      return;
    }
    local_50.ptr_._0_4_ = 0x35 - local_51;
    testing::internal::CmpHelperEQ<int,char>
              ((internal *)&gtest_ar,"\'5\' - count","*iter",(int *)&local_50,"012345" + lVar1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                 ,0x69,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      goto LAB_00206e37;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_51 = local_51 + '\x01';
    lVar1 = lVar1 + -1;
  } while( true );
}

Assistant:

TEST(string_view, rbegin_rend) {
  string_view sv("012345");

  char count = 0;
  for (auto iter = sv.rbegin(), end = sv.rend(); iter != end; ++iter) {
    ASSERT_EQ('5' - count, *iter);
    ++count;
  }
  ASSERT_EQ(6, count);
}